

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

Camera pbrt::Camera::Create
                 (string *name,ParameterDictionary *parameters,Medium *medium,
                 CameraTransform *cameraTransform,Film *film,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  FileLoc *in_RCX;
  SphericalCamera *in_RDX;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char *in_R9;
  ParameterDictionary *in_stack_000000c0;
  Camera *camera;
  FileLoc *in_stack_000003d8;
  Medium *in_stack_000003e0;
  Film *in_stack_000003e8;
  CameraTransform *in_stack_000003f0;
  ParameterDictionary *in_stack_000003f8;
  Allocator in_stack_00000400;
  FileLoc *in_stack_00000418;
  Medium *in_stack_00000420;
  Film *in_stack_00000428;
  CameraTransform *in_stack_00000430;
  ParameterDictionary *in_stack_00000438;
  Allocator in_stack_00000440;
  FileLoc *in_stack_00000468;
  Medium *in_stack_00000470;
  Film *in_stack_00000478;
  CameraTransform *in_stack_00000480;
  ParameterDictionary *in_stack_00000488;
  Allocator in_stack_00000490;
  FileLoc *in_stack_00001110;
  Medium *in_stack_00001118;
  Film *in_stack_00001120;
  CameraTransform *in_stack_00001128;
  ParameterDictionary *in_stack_00001130;
  Allocator in_stack_00001138;
  PerspectiveCamera *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  
  Camera((Camera *)0x7201cb);
  bVar1 = std::operator==(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  if (bVar1) {
    Film::Film((Film *)in_stack_fffffffffffffef0,(Film *)in_stack_fffffffffffffee8);
    Medium::Medium((Medium *)in_stack_fffffffffffffef0,(Medium *)in_stack_fffffffffffffee8);
    PerspectiveCamera::Create
              (in_stack_00000438,in_stack_00000430,in_stack_00000428,in_stack_00000420,
               in_stack_00000418,in_stack_00000440);
    TaggedPointer<pbrt::PerspectiveCamera>
              ((Camera *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    operator=((Camera *)in_stack_fffffffffffffef0,(Camera *)in_stack_fffffffffffffee8);
    in_stack_ffffffffffffff20 = in_R8;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    if (bVar1) {
      Film::Film((Film *)in_stack_fffffffffffffef0,(Film *)in_stack_fffffffffffffee8);
      Medium::Medium((Medium *)in_stack_fffffffffffffef0,(Medium *)in_stack_fffffffffffffee8);
      OrthographicCamera::Create
                (in_stack_000003f8,in_stack_000003f0,in_stack_000003e8,in_stack_000003e0,
                 in_stack_000003d8,in_stack_00000400);
      TaggedPointer<pbrt::OrthographicCamera>
                ((Camera *)in_stack_fffffffffffffef0,(OrthographicCamera *)in_stack_fffffffffffffee8
                );
      operator=((Camera *)in_stack_fffffffffffffef0,(Camera *)in_stack_fffffffffffffee8);
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
      if (bVar1) {
        Film::Film((Film *)in_stack_fffffffffffffef0,(Film *)in_stack_fffffffffffffee8);
        Medium::Medium((Medium *)in_stack_fffffffffffffef0,(Medium *)in_stack_fffffffffffffee8);
        RealisticCamera::Create
                  (in_stack_00001130,in_stack_00001128,in_stack_00001120,in_stack_00001118,
                   in_stack_00001110,in_stack_00001138);
        TaggedPointer<pbrt::RealisticCamera>
                  ((Camera *)in_stack_fffffffffffffef0,(RealisticCamera *)in_stack_fffffffffffffee8)
        ;
        operator=((Camera *)in_stack_fffffffffffffef0,(Camera *)in_stack_fffffffffffffee8);
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
        if (!bVar1) {
          ErrorExit<std::__cxx11::string_const&>(in_RCX,in_R9,in_stack_ffffffffffffff20);
        }
        Film::Film((Film *)in_R8,(Film *)in_RDX);
        Medium::Medium((Medium *)in_R8,(Medium *)in_RDX);
        SphericalCamera::Create
                  (in_stack_00000488,in_stack_00000480,in_stack_00000478,in_stack_00000470,
                   in_stack_00000468,in_stack_00000490);
        TaggedPointer<pbrt::SphericalCamera>((Camera *)in_R8,in_RDX);
        operator=((Camera *)in_R8,(Camera *)in_RDX);
      }
    }
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI.bits);
  if (bVar1) {
    ParameterDictionary::ReportUnused(in_stack_000000c0);
    return (Camera)(TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                    )in_RDI.bits;
  }
  ErrorExit<std::__cxx11::string_const&>(in_RCX,in_R9,in_stack_ffffffffffffff20);
}

Assistant:

Camera Camera::Create(const std::string &name, const ParameterDictionary &parameters,
                      Medium medium, const CameraTransform &cameraTransform, Film film,
                      const FileLoc *loc, Allocator alloc) {
    Camera camera;
    if (name == "perspective")
        camera = PerspectiveCamera::Create(parameters, cameraTransform, film, medium, loc,
                                           alloc);
    else if (name == "orthographic")
        camera = OrthographicCamera::Create(parameters, cameraTransform, film, medium,
                                            loc, alloc);
    else if (name == "realistic")
        camera = RealisticCamera::Create(parameters, cameraTransform, film, medium, loc,
                                         alloc);
    else if (name == "spherical")
        camera = SphericalCamera::Create(parameters, cameraTransform, film, medium, loc,
                                         alloc);
    else
        ErrorExit(loc, "%s: camera type unknown.", name);

    if (!camera)
        ErrorExit(loc, "%s: unable to create camera.", name);

    parameters.ReportUnused();
    return camera;
}